

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

fid __thiscall ezexample::addf(ezexample *this,char to_ns,fid fint,float v)

{
  size_t *psVar1;
  vw *pvVar2;
  bool bVar3;
  uint32_t *puVar4;
  fid fVar5;
  
  fVar5 = 0;
  if (to_ns != '\0') {
    bVar3 = ensure_ns_exists(this,to_ns);
    fVar5 = 0;
    if (!bVar3) {
      pvVar2 = this->vw_ref;
      puVar4 = &(pvVar2->weights).dense_weights._stride_shift;
      if ((pvVar2->weights).sparse != false) {
        puVar4 = &(pvVar2->weights).sparse_weights._stride_shift;
      }
      features::push_back((this->ec->super_example_predict).feature_space + to_ns,v,
                          (ulong)(fint << ((byte)*puVar4 & 0x1f)));
      this->ec->total_sum_feat_sq = v * v + this->ec->total_sum_feat_sq;
      psVar1 = &this->ec->num_features;
      *psVar1 = *psVar1 + 1;
      this->example_changed_since_prediction = true;
      fVar5 = fint;
    }
  }
  return fVar5;
}

Assistant:

inline fid addf(char to_ns, fid fint, float v)
  {
    if (to_ns == 0)
      return 0;
    if (ensure_ns_exists(to_ns))
      return 0;

    ec->feature_space[(int)to_ns].push_back(v, fint << vw_ref->weights.stride_shift());
    ec->total_sum_feat_sq += v * v;
    ec->num_features++;
    example_changed_since_prediction = true;
    return fint;
  }